

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exomizer.h
# Opt level: O2

void log_add_output_stream
               (log_ctx *ctx,log_level min,log_level max,log_formatter_f *default_f,FILE *out_stream
               )

{
  long lVar1;
  log_output *plVar2;
  
  lVar1 = (long)ctx->out_len + 1;
  ctx->out_len = (int)lVar1;
  plVar2 = (log_output *)realloc(ctx->out,lVar1 * 0x18);
  ctx->out = plVar2;
  if (plVar2 != (log_output *)0x0) {
    lVar1 = (long)ctx->out_len;
    plVar2[lVar1 + -1].min = min;
    plVar2[lVar1 + -1].max = max;
    plVar2[lVar1 + -1].stream = out_stream;
    plVar2[lVar1 + -1].f = default_f;
    return;
  }
  fwrite("fatal error, can\'t allocate memory for log output\n",0x32,1,_stderr);
  exit(1);
}

Assistant:

void log_add_output_stream(struct log_ctx *ctx, /* IN/OUT */
                           enum log_level min,  /* IN */
                           enum log_level max,  /* IN */
                           log_formatter_f * default_f, /* IN */
                           FILE * out_stream)   /* IN */
{
    struct log_output *out;

    ctx->out_len += 1;
    ctx->out = realloc(ctx->out, ctx->out_len * sizeof(*(ctx->out)));
    if (ctx->out == NULL)
    {
        fprintf(stderr,
                "fatal error, can't allocate memory for log output\n");
        exit(1);
    }
    out = &(ctx->out[ctx->out_len - 1]);
    out->min = min;
    out->max = max;
    out->stream = out_stream;
    out->f = default_f;
}